

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O0

void aom_h_predictor_4x16_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uint8_t *puVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 uStack_2e0;
  undefined1 uStack_2df;
  undefined1 uStack_2de;
  undefined1 uStack_2dd;
  undefined1 uStack_2d0;
  undefined1 uStack_2cf;
  undefined1 uStack_2ce;
  undefined1 uStack_2cd;
  undefined4 local_298;
  undefined4 local_278;
  undefined4 local_258;
  undefined4 local_238;
  undefined4 local_218;
  undefined4 local_1f8;
  undefined4 local_1d8;
  undefined4 local_1b8;
  undefined4 local_198;
  undefined4 local_178;
  undefined4 local_158;
  undefined4 local_138;
  undefined4 local_118;
  undefined4 local_f8;
  undefined4 local_d8;
  undefined4 local_b8;
  undefined1 uStack_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined1 uStack_85;
  undefined1 uStack_84;
  undefined1 uStack_83;
  undefined1 uStack_82;
  undefined1 uStack_81;
  __m128i row3;
  __m128i row2;
  __m128i row1;
  __m128i row0;
  __m128i left_col_high;
  __m128i left_col_low;
  __m128i left_col;
  uint8_t *left_local;
  uint8_t *above_local;
  
  uVar1 = *(undefined8 *)left;
  uVar2 = *(undefined8 *)(left + 8);
  uStack_88 = (undefined1)uVar1;
  uStack_87 = (undefined1)((ulong)uVar1 >> 8);
  uStack_86 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_85 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_84 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_83 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_82 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_81 = (undefined1)((ulong)uVar1 >> 0x38);
  left_local._0_1_ = (undefined1)uVar2;
  left_local._1_1_ = (undefined1)((ulong)uVar2 >> 8);
  left_local._2_1_ = (undefined1)((ulong)uVar2 >> 0x10);
  left_local._3_1_ = (undefined1)((ulong)uVar2 >> 0x18);
  left_local._4_1_ = (undefined1)((ulong)uVar2 >> 0x20);
  left_local._5_1_ = (undefined1)((ulong)uVar2 >> 0x28);
  left_local._6_1_ = (undefined1)((ulong)uVar2 >> 0x30);
  left_local._7_1_ = (undefined1)((ulong)uVar2 >> 0x38);
  auVar7[1] = uStack_88;
  auVar7[0] = uStack_88;
  auVar7[2] = uStack_87;
  auVar7[3] = uStack_87;
  auVar7[4] = uStack_86;
  auVar7[5] = uStack_86;
  auVar7[6] = uStack_85;
  auVar7[7] = uStack_85;
  auVar7[8] = uStack_84;
  auVar7[9] = uStack_84;
  auVar7[10] = uStack_83;
  auVar7[0xb] = uStack_83;
  auVar7[0xc] = uStack_82;
  auVar7[0xd] = uStack_82;
  auVar7[0xe] = uStack_81;
  auVar7[0xf] = uStack_81;
  auVar16 = pshuflw(auVar7,auVar7,0);
  auVar8[1] = uStack_88;
  auVar8[0] = uStack_88;
  auVar8[2] = uStack_87;
  auVar8[3] = uStack_87;
  auVar8[4] = uStack_86;
  auVar8[5] = uStack_86;
  auVar8[6] = uStack_85;
  auVar8[7] = uStack_85;
  auVar8[8] = uStack_84;
  auVar8[9] = uStack_84;
  auVar8[10] = uStack_83;
  auVar8[0xb] = uStack_83;
  auVar8[0xc] = uStack_82;
  auVar8[0xd] = uStack_82;
  auVar8[0xe] = uStack_81;
  auVar8[0xf] = uStack_81;
  auVar17 = pshuflw(auVar8,auVar8,0x55);
  auVar9[1] = uStack_88;
  auVar9[0] = uStack_88;
  auVar9[2] = uStack_87;
  auVar9[3] = uStack_87;
  auVar9[4] = uStack_86;
  auVar9[5] = uStack_86;
  auVar9[6] = uStack_85;
  auVar9[7] = uStack_85;
  auVar9[8] = uStack_84;
  auVar9[9] = uStack_84;
  auVar9[10] = uStack_83;
  auVar9[0xb] = uStack_83;
  auVar9[0xc] = uStack_82;
  auVar9[0xd] = uStack_82;
  auVar9[0xe] = uStack_81;
  auVar9[0xf] = uStack_81;
  auVar18 = pshuflw(auVar9,auVar9,0xaa);
  auVar10[1] = uStack_88;
  auVar10[0] = uStack_88;
  auVar10[2] = uStack_87;
  auVar10[3] = uStack_87;
  auVar10[4] = uStack_86;
  auVar10[5] = uStack_86;
  auVar10[6] = uStack_85;
  auVar10[7] = uStack_85;
  auVar10[8] = uStack_84;
  auVar10[9] = uStack_84;
  auVar10[10] = uStack_83;
  auVar10[0xb] = uStack_83;
  auVar10[0xc] = uStack_82;
  auVar10[0xd] = uStack_82;
  auVar10[0xe] = uStack_81;
  auVar10[0xf] = uStack_81;
  auVar19 = pshuflw(auVar10,auVar10,0xff);
  local_b8 = auVar16._0_4_;
  *(undefined4 *)dst = local_b8;
  puVar15 = dst + stride;
  local_d8 = auVar17._0_4_;
  *(undefined4 *)puVar15 = local_d8;
  puVar15 = puVar15 + stride;
  local_f8 = auVar18._0_4_;
  *(undefined4 *)puVar15 = local_f8;
  puVar15 = puVar15 + stride;
  local_118 = auVar19._0_4_;
  *(undefined4 *)puVar15 = local_118;
  puVar15 = puVar15 + stride;
  uStack_2d0 = (undefined1)(undefined4)left_col_high[0];
  uStack_2cf = (undefined1)((uint)(undefined4)left_col_high[0] >> 8);
  uStack_2ce = (undefined1)((uint)(undefined4)left_col_high[0] >> 0x10);
  uStack_2cd = (undefined1)((uint)(undefined4)left_col_high[0] >> 0x18);
  auVar11[1] = uStack_88;
  auVar11[0] = uStack_88;
  auVar11[2] = uStack_87;
  auVar11[3] = uStack_87;
  auVar11[4] = uStack_86;
  auVar11[5] = uStack_86;
  auVar11[6] = uStack_85;
  auVar11[7] = uStack_85;
  auVar11[8] = uStack_2d0;
  auVar11[9] = uStack_2cf;
  auVar11[10] = uStack_2ce;
  auVar11[0xb] = uStack_2cd;
  auVar11[0xc] = uStack_82;
  auVar11[0xd] = uStack_82;
  auVar11[0xe] = uStack_81;
  auVar11[0xf] = uStack_81;
  auVar16 = pshuflw(auVar11,auVar11,0);
  auVar12[1] = uStack_88;
  auVar12[0] = uStack_88;
  auVar12[2] = uStack_87;
  auVar12[3] = uStack_87;
  auVar12[4] = uStack_86;
  auVar12[5] = uStack_86;
  auVar12[6] = uStack_85;
  auVar12[7] = uStack_85;
  auVar12[8] = uStack_2d0;
  auVar12[9] = uStack_2cf;
  auVar12[10] = uStack_2ce;
  auVar12[0xb] = uStack_2cd;
  auVar12[0xc] = uStack_82;
  auVar12[0xd] = uStack_82;
  auVar12[0xe] = uStack_81;
  auVar12[0xf] = uStack_81;
  auVar17 = pshuflw(auVar12,auVar12,0x55);
  auVar13[1] = uStack_88;
  auVar13[0] = uStack_88;
  auVar13[2] = uStack_87;
  auVar13[3] = uStack_87;
  auVar13[4] = uStack_86;
  auVar13[5] = uStack_86;
  auVar13[6] = uStack_85;
  auVar13[7] = uStack_85;
  auVar13[8] = uStack_2d0;
  auVar13[9] = uStack_2cf;
  auVar13[10] = uStack_2ce;
  auVar13[0xb] = uStack_2cd;
  auVar13[0xc] = uStack_82;
  auVar13[0xd] = uStack_82;
  auVar13[0xe] = uStack_81;
  auVar13[0xf] = uStack_81;
  auVar18 = pshuflw(auVar13,auVar13,0xaa);
  auVar14[1] = uStack_88;
  auVar14[0] = uStack_88;
  auVar14[2] = uStack_87;
  auVar14[3] = uStack_87;
  auVar14[4] = uStack_86;
  auVar14[5] = uStack_86;
  auVar14[6] = uStack_85;
  auVar14[7] = uStack_85;
  auVar14[8] = uStack_2d0;
  auVar14[9] = uStack_2cf;
  auVar14[10] = uStack_2ce;
  auVar14[0xb] = uStack_2cd;
  auVar14[0xc] = uStack_82;
  auVar14[0xd] = uStack_82;
  auVar14[0xe] = uStack_81;
  auVar14[0xf] = uStack_81;
  auVar19 = pshuflw(auVar14,auVar14,0xff);
  local_138 = auVar16._0_4_;
  *(undefined4 *)puVar15 = local_138;
  puVar15 = puVar15 + stride;
  local_158 = auVar17._0_4_;
  *(undefined4 *)puVar15 = local_158;
  puVar15 = puVar15 + stride;
  local_178 = auVar18._0_4_;
  *(undefined4 *)puVar15 = local_178;
  puVar15 = puVar15 + stride;
  local_198 = auVar19._0_4_;
  *(undefined4 *)puVar15 = local_198;
  puVar15 = puVar15 + stride;
  auVar16[1] = left_local._0_1_;
  auVar16[0] = left_local._0_1_;
  auVar16[2] = left_local._1_1_;
  auVar16[3] = left_local._1_1_;
  auVar16[4] = left_local._2_1_;
  auVar16[5] = left_local._2_1_;
  auVar16[6] = left_local._3_1_;
  auVar16[7] = left_local._3_1_;
  auVar16[8] = left_local._4_1_;
  auVar16[9] = left_local._4_1_;
  auVar16[10] = left_local._5_1_;
  auVar16[0xb] = left_local._5_1_;
  auVar16[0xc] = left_local._6_1_;
  auVar16[0xd] = left_local._6_1_;
  auVar16[0xe] = left_local._7_1_;
  auVar16[0xf] = left_local._7_1_;
  auVar16 = pshuflw(auVar16,auVar16,0);
  auVar17[1] = left_local._0_1_;
  auVar17[0] = left_local._0_1_;
  auVar17[2] = left_local._1_1_;
  auVar17[3] = left_local._1_1_;
  auVar17[4] = left_local._2_1_;
  auVar17[5] = left_local._2_1_;
  auVar17[6] = left_local._3_1_;
  auVar17[7] = left_local._3_1_;
  auVar17[8] = left_local._4_1_;
  auVar17[9] = left_local._4_1_;
  auVar17[10] = left_local._5_1_;
  auVar17[0xb] = left_local._5_1_;
  auVar17[0xc] = left_local._6_1_;
  auVar17[0xd] = left_local._6_1_;
  auVar17[0xe] = left_local._7_1_;
  auVar17[0xf] = left_local._7_1_;
  auVar17 = pshuflw(auVar17,auVar17,0x55);
  auVar18[1] = left_local._0_1_;
  auVar18[0] = left_local._0_1_;
  auVar18[2] = left_local._1_1_;
  auVar18[3] = left_local._1_1_;
  auVar18[4] = left_local._2_1_;
  auVar18[5] = left_local._2_1_;
  auVar18[6] = left_local._3_1_;
  auVar18[7] = left_local._3_1_;
  auVar18[8] = left_local._4_1_;
  auVar18[9] = left_local._4_1_;
  auVar18[10] = left_local._5_1_;
  auVar18[0xb] = left_local._5_1_;
  auVar18[0xc] = left_local._6_1_;
  auVar18[0xd] = left_local._6_1_;
  auVar18[0xe] = left_local._7_1_;
  auVar18[0xf] = left_local._7_1_;
  auVar18 = pshuflw(auVar18,auVar18,0xaa);
  auVar19[1] = left_local._0_1_;
  auVar19[0] = left_local._0_1_;
  auVar19[2] = left_local._1_1_;
  auVar19[3] = left_local._1_1_;
  auVar19[4] = left_local._2_1_;
  auVar19[5] = left_local._2_1_;
  auVar19[6] = left_local._3_1_;
  auVar19[7] = left_local._3_1_;
  auVar19[8] = left_local._4_1_;
  auVar19[9] = left_local._4_1_;
  auVar19[10] = left_local._5_1_;
  auVar19[0xb] = left_local._5_1_;
  auVar19[0xc] = left_local._6_1_;
  auVar19[0xd] = left_local._6_1_;
  auVar19[0xe] = left_local._7_1_;
  auVar19[0xf] = left_local._7_1_;
  auVar19 = pshuflw(auVar19,auVar19,0xff);
  local_1b8 = auVar16._0_4_;
  *(undefined4 *)puVar15 = local_1b8;
  puVar15 = puVar15 + stride;
  local_1d8 = auVar17._0_4_;
  *(undefined4 *)puVar15 = local_1d8;
  puVar15 = puVar15 + stride;
  local_1f8 = auVar18._0_4_;
  *(undefined4 *)puVar15 = local_1f8;
  puVar15 = puVar15 + stride;
  local_218 = auVar19._0_4_;
  *(undefined4 *)puVar15 = local_218;
  puVar15 = puVar15 + stride;
  uStack_2e0 = (undefined1)(undefined4)row1[0];
  uStack_2df = (undefined1)((uint)(undefined4)row1[0] >> 8);
  uStack_2de = (undefined1)((uint)(undefined4)row1[0] >> 0x10);
  uStack_2dd = (undefined1)((uint)(undefined4)row1[0] >> 0x18);
  auVar3[1] = left_local._0_1_;
  auVar3[0] = left_local._0_1_;
  auVar3[2] = left_local._1_1_;
  auVar3[3] = left_local._1_1_;
  auVar3[4] = left_local._2_1_;
  auVar3[5] = left_local._2_1_;
  auVar3[6] = left_local._3_1_;
  auVar3[7] = left_local._3_1_;
  auVar3[8] = uStack_2e0;
  auVar3[9] = uStack_2df;
  auVar3[10] = uStack_2de;
  auVar3[0xb] = uStack_2dd;
  auVar3[0xc] = left_local._6_1_;
  auVar3[0xd] = left_local._6_1_;
  auVar3[0xe] = left_local._7_1_;
  auVar3[0xf] = left_local._7_1_;
  auVar16 = pshuflw(auVar3,auVar3,0);
  auVar4[1] = left_local._0_1_;
  auVar4[0] = left_local._0_1_;
  auVar4[2] = left_local._1_1_;
  auVar4[3] = left_local._1_1_;
  auVar4[4] = left_local._2_1_;
  auVar4[5] = left_local._2_1_;
  auVar4[6] = left_local._3_1_;
  auVar4[7] = left_local._3_1_;
  auVar4[8] = uStack_2e0;
  auVar4[9] = uStack_2df;
  auVar4[10] = uStack_2de;
  auVar4[0xb] = uStack_2dd;
  auVar4[0xc] = left_local._6_1_;
  auVar4[0xd] = left_local._6_1_;
  auVar4[0xe] = left_local._7_1_;
  auVar4[0xf] = left_local._7_1_;
  auVar17 = pshuflw(auVar4,auVar4,0x55);
  auVar5[1] = left_local._0_1_;
  auVar5[0] = left_local._0_1_;
  auVar5[2] = left_local._1_1_;
  auVar5[3] = left_local._1_1_;
  auVar5[4] = left_local._2_1_;
  auVar5[5] = left_local._2_1_;
  auVar5[6] = left_local._3_1_;
  auVar5[7] = left_local._3_1_;
  auVar5[8] = uStack_2e0;
  auVar5[9] = uStack_2df;
  auVar5[10] = uStack_2de;
  auVar5[0xb] = uStack_2dd;
  auVar5[0xc] = left_local._6_1_;
  auVar5[0xd] = left_local._6_1_;
  auVar5[0xe] = left_local._7_1_;
  auVar5[0xf] = left_local._7_1_;
  auVar18 = pshuflw(auVar5,auVar5,0xaa);
  auVar6[1] = left_local._0_1_;
  auVar6[0] = left_local._0_1_;
  auVar6[2] = left_local._1_1_;
  auVar6[3] = left_local._1_1_;
  auVar6[4] = left_local._2_1_;
  auVar6[5] = left_local._2_1_;
  auVar6[6] = left_local._3_1_;
  auVar6[7] = left_local._3_1_;
  auVar6[8] = uStack_2e0;
  auVar6[9] = uStack_2df;
  auVar6[10] = uStack_2de;
  auVar6[0xb] = uStack_2dd;
  auVar6[0xc] = left_local._6_1_;
  auVar6[0xd] = left_local._6_1_;
  auVar6[0xe] = left_local._7_1_;
  auVar6[0xf] = left_local._7_1_;
  auVar19 = pshuflw(auVar6,auVar6,0xff);
  local_238 = auVar16._0_4_;
  *(undefined4 *)puVar15 = local_238;
  puVar15 = puVar15 + stride;
  local_258 = auVar17._0_4_;
  *(undefined4 *)puVar15 = local_258;
  local_278 = auVar18._0_4_;
  *(undefined4 *)(puVar15 + stride) = local_278;
  local_298 = auVar19._0_4_;
  *(undefined4 *)(puVar15 + stride + stride) = local_298;
  return;
}

Assistant:

void aom_h_predictor_4x16_sse2(uint8_t *dst, ptrdiff_t stride,
                               const uint8_t *above, const uint8_t *left) {
  (void)above;
  const __m128i left_col = _mm_load_si128((__m128i const *)left);
  __m128i left_col_low = _mm_unpacklo_epi8(left_col, left_col);
  __m128i left_col_high = _mm_unpackhi_epi8(left_col, left_col);

  __m128i row0 = _mm_shufflelo_epi16(left_col_low, 0);
  __m128i row1 = _mm_shufflelo_epi16(left_col_low, 0x55);
  __m128i row2 = _mm_shufflelo_epi16(left_col_low, 0xaa);
  __m128i row3 = _mm_shufflelo_epi16(left_col_low, 0xff);
  *(int *)dst = _mm_cvtsi128_si32(row0);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row1);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row2);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row3);
  dst += stride;

  left_col_low = _mm_unpackhi_epi64(left_col_low, left_col_low);
  row0 = _mm_shufflelo_epi16(left_col_low, 0);
  row1 = _mm_shufflelo_epi16(left_col_low, 0x55);
  row2 = _mm_shufflelo_epi16(left_col_low, 0xaa);
  row3 = _mm_shufflelo_epi16(left_col_low, 0xff);
  *(int *)dst = _mm_cvtsi128_si32(row0);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row1);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row2);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row3);
  dst += stride;

  row0 = _mm_shufflelo_epi16(left_col_high, 0);
  row1 = _mm_shufflelo_epi16(left_col_high, 0x55);
  row2 = _mm_shufflelo_epi16(left_col_high, 0xaa);
  row3 = _mm_shufflelo_epi16(left_col_high, 0xff);
  *(int *)dst = _mm_cvtsi128_si32(row0);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row1);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row2);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row3);
  dst += stride;

  left_col_high = _mm_unpackhi_epi64(left_col_high, left_col_high);
  row0 = _mm_shufflelo_epi16(left_col_high, 0);
  row1 = _mm_shufflelo_epi16(left_col_high, 0x55);
  row2 = _mm_shufflelo_epi16(left_col_high, 0xaa);
  row3 = _mm_shufflelo_epi16(left_col_high, 0xff);
  *(int *)dst = _mm_cvtsi128_si32(row0);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row1);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row2);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row3);
}